

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O1

void my_reflection_example(void)

{
  pointer pcVar1;
  ChValue *pCVar2;
  bool bVar3;
  int iVar4;
  ChStreamOutAscii *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  int my_foo;
  int my_age;
  vector<myEmployee,_std::allocator<myEmployee>_> mcontainer;
  myEmployee a_employee;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> props2;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> props;
  myEmployee my_slave;
  double my_wages;
  ChArchiveExplorer mexplorer2;
  myEmployeeBoss m_boss;
  ChArchiveExplorer mexplorer;
  int local_560;
  int local_55c;
  vector<myEmployee,_std::allocator<myEmployee>_> local_558;
  undefined1 local_540 [32];
  _Alloc_hider local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> local_500;
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> local_4e8;
  string local_4d0;
  pointer local_4b0;
  pointer local_4a8;
  long *local_4a0;
  long local_498;
  long local_490 [2];
  long *local_480;
  long local_478;
  long local_470 [2];
  long *local_460;
  long local_458;
  long local_450 [2];
  long *local_440;
  long local_438;
  long local_430 [2];
  undefined1 local_420 [32];
  _Alloc_hider local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f0;
  double local_3e0;
  undefined1 local_3d8 [32];
  __node_base local_3b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined **local_390;
  _Alloc_hider local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360 [12];
  vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_> local_298;
  bool local_27f;
  myEmployeeBoss local_248;
  ChArchiveExplorer local_1c0;
  
  chrono::ChArchiveExplorer::ChArchiveExplorer(&local_1c0);
  local_1c0.use_wildcards = true;
  local_1c0.use_user_names = true;
  myEmployeeBoss::myEmployeeBoss(&local_248,0x47,42000.4,true);
  local_248.super_myEmployee.body = FAT;
  pcVar1 = local_3d8 + 0x10;
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"wages","");
  bVar3 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,double>
                    (&local_1c0,&local_3e0,&local_248,(string *)local_3d8);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar5,"Property explorer : retrieved \'wages\'=")
    ;
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,local_3e0);
    pcVar6 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar6 = "Property explorer : cannot retrieve \'wages\'! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar6);
  local_440 = local_430;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"John","");
  local_420._0_8_ = &PTR__myEmployee_00158370;
  local_420._8_4_ = 0x12;
  local_420._16_8_ = 1020.3;
  local_420._24_4_ = ATHLETIC;
  local_400._M_p = (pointer)&local_3f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_400,local_440,local_438 + (long)local_440);
  if (local_440 != local_430) {
    operator_delete(local_440,local_430[0] + 1);
  }
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"slave","");
  bVar3 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,myEmployee>
                    (&local_1c0,(myEmployee *)local_420,&local_248,(string *)local_3d8);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,"Property explorer : retrieved \'slave\'=\n");
    pCVar5 = chrono::operator<<(pCVar5,(myEmployee *)local_420);
    pcVar6 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar6 = "Property explorer : cannot retrieve \'slave\'! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar6);
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"s?*e/age","");
  bVar3 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,int>
                    (&local_1c0,&local_55c,&local_248,(string *)local_3d8);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,"Property explorer : retrieved \'slave/age\'=");
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,local_55c);
    pcVar6 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar6 = "Property explorer : cannot retrieve \'slave/age\'! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar6);
  local_560 = 0x7b;
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"foo","");
  bVar3 = chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,int>
                    (&local_1c0,&local_560,&local_248,(string *)local_3d8);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,"Property explorer : retrieved \'int foo\'=");
    pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,local_560);
    pcVar6 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar6 = "Property explorer : cannot retrieve \'int foo\'! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar6);
  local_558.super__Vector_base<myEmployee,_std::allocator<myEmployee>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.super__Vector_base<myEmployee,_std::allocator<myEmployee>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.super__Vector_base<myEmployee,_std::allocator<myEmployee>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_460 = local_450;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"Josh","");
  local_3d8._0_8_ = &PTR__myEmployee_00158370;
  local_3d8._8_4_ = 0x13;
  local_3d8._16_8_ = 0x40af400000000000;
  local_3d8._24_4_ = 0;
  local_3b8._M_nxt = (_Hash_node_base *)&local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b8,local_460,local_458 + (long)local_460);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::emplace_back<myEmployee>
            (&local_558,(myEmployee *)local_3d8);
  local_3d8._0_8_ = &PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_nxt != &local_3a8) {
    operator_delete(local_3b8._M_nxt,local_3a8._M_allocated_capacity + 1);
  }
  if (local_460 != local_450) {
    operator_delete(local_460,local_450[0] + 1);
  }
  myEmployeeBoss::myEmployeeBoss((myEmployeeBoss *)local_3d8,0x1d,5000.0,true);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::emplace_back<myEmployee>
            (&local_558,(myEmployee *)local_3d8);
  local_3d8._0_8_ = &PTR__myEmployeeBoss_00158338;
  local_390 = &PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_p != local_360) {
    operator_delete(local_370._M_p,local_360[0]._M_allocated_capacity + 1);
  }
  local_3d8._0_8_ = &PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_nxt != &local_3a8) {
    operator_delete(local_3b8._M_nxt,local_3a8._M_allocated_capacity + 1);
  }
  local_480 = local_470;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"Marie","");
  local_3d8._0_8_ = &PTR__myEmployee_00158370;
  local_3d8._8_4_ = 0x1f;
  local_3d8._16_8_ = 0x40b7700000000000;
  local_3d8._24_4_ = 0;
  local_3b8._M_nxt = (_Hash_node_base *)&local_3a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b8,local_480,local_478 + (long)local_480);
  std::vector<myEmployee,_std::allocator<myEmployee>_>::emplace_back<myEmployee>
            (&local_558,(myEmployee *)local_3d8);
  local_3d8._0_8_ = &PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_nxt != &local_3a8) {
    operator_delete(local_3b8._M_nxt,local_3a8._M_allocated_capacity + 1);
  }
  if (local_480 != local_470) {
    operator_delete(local_480,local_470[0] + 1);
  }
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"John","");
  local_540._0_8_ = &PTR__myEmployee_00158370;
  local_540._8_4_ = 0x12;
  local_540._16_8_ = 1020.3;
  local_540._24_4_ = ATHLETIC;
  local_520._M_p = (pointer)&local_510;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_520,local_4a0,local_498 + (long)local_4a0);
  if (local_4a0 != local_490) {
    operator_delete(local_4a0,local_490[0] + 1);
  }
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"1","");
  bVar3 = chrono::ChArchiveExplorer::
          FetchValue<std::vector<myEmployee,std::allocator<myEmployee>>,myEmployee>
                    (&local_1c0,(myEmployee *)local_540,&local_558,(string *)local_3d8);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,
                        "Property explorer : retrieved from element number in container \'1\' =\n");
    pCVar5 = chrono::operator<<(pCVar5,(myEmployee *)local_540);
    pcVar6 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar6 = "Property explorer : cannot retrieve from element number! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar6);
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"\'Marie\'","");
  bVar3 = chrono::ChArchiveExplorer::
          FetchValue<std::vector<myEmployee,std::allocator<myEmployee>>,myEmployee>
                    (&local_1c0,(myEmployee *)local_540,&local_558,(string *)local_3d8);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  if (bVar3) {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pCVar5 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar5,
                        "Property explorer : retrieved from element container name \'Marie\' =\n");
    pCVar5 = chrono::operator<<(pCVar5,(myEmployee *)local_540);
    pcVar6 = "\n";
  }
  else {
    pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
    pcVar6 = "Property explorer : cannot retrieve from element container name! \n";
  }
  chrono::ChStreamOutAscii::operator<<(pCVar5,pcVar6);
  pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar5 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar5,"This has sub properties? : ");
  bVar3 = chrono::ChArchiveExplorer::IsObject<std::vector<myEmployee,std::allocator<myEmployee>>>
                    (&local_1c0,&local_558);
  pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,bVar3);
  chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
  pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar5 = (ChStreamOutAscii *)
           chrono::ChStreamOutAscii::operator<<(pCVar5,"This has sub properties? : ");
  bVar3 = chrono::ChArchiveExplorer::IsObject<int>(&local_1c0,&local_55c);
  pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,bVar3);
  chrono::ChStreamOutAscii::operator<<(pCVar5,"\n\n");
  pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar5,"List of fetched properties in std::vector of employees: \n");
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"*","");
  chrono::ChArchiveExplorer::PrepareSearch(&local_1c0,(string *)local_3d8);
  local_1c0.find_all = true;
  local_4d0._M_dataplus._M_p = "";
  local_4d0.field_2._M_local_buf[0] = '\0';
  local_4d0._M_string_length = (size_type)&local_558;
  chrono::ChArchiveOut::out<myEmployee>
            (&local_1c0.super_ChArchiveOut,
             (ChNameValue<std::vector<myEmployee,_std::allocator<myEmployee>_>_> *)&local_4d0);
  std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::vector
            (&local_4e8,&local_1c0.results);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_,local_3d8._16_8_ + 1);
  }
  local_4b0 = local_4e8.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  ppCVar7 = local_4e8.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_4e8.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_4e8.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pCVar2 = *ppCVar7;
      pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5," val: ");
      pCVar5 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<(pCVar5,(pCVar2->_name)._M_dataplus._M_p);
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,",  reg.class: ");
      iVar4 = (*pCVar2->_vptr_ChValue[3])(pCVar2);
      pCVar5 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<(pCVar5,(string *)CONCAT44(extraout_var,iVar4));
      pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,",  typeid: ");
      iVar4 = (*pCVar2->_vptr_ChValue[5])(pCVar2);
      pCVar5 = (ChStreamOutAscii *)
               chrono::ChStreamOutAscii::operator<<(pCVar5,(char *)CONCAT44(extraout_var_00,iVar4));
      chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
      chrono::ChArchiveExplorer::ChArchiveExplorer((ChArchiveExplorer *)local_3d8);
      local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"*","");
      chrono::ChArchiveExplorer::PrepareSearch((ChArchiveExplorer *)local_3d8,&local_4d0);
      local_27f = true;
      (*pCVar2->_vptr_ChValue[0x11])(pCVar2,local_3d8);
      std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::vector
                (&local_500,&local_298);
      ppCVar8 = local_500.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_4a8 = ppCVar7;
      ppCVar7 = local_500.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
        operator_delete(local_4d0._M_dataplus._M_p,
                        CONCAT71(local_4d0.field_2._M_allocated_capacity._1_7_,
                                 local_4d0.field_2._M_local_buf[0]) + 1);
        ppCVar8 = local_500.
                  super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppCVar7 = local_500.
                  super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      for (; ppCVar8 != ppCVar7; ppCVar8 = ppCVar8 + 1) {
        pCVar2 = *ppCVar8;
        pCVar5 = (ChStreamOutAscii *)chrono::GetLog();
        pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,"    val: ");
        pCVar5 = (ChStreamOutAscii *)
                 chrono::ChStreamOutAscii::operator<<(pCVar5,(pCVar2->_name)._M_dataplus._M_p);
        pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,",  reg.class: ");
        iVar4 = (*pCVar2->_vptr_ChValue[3])(pCVar2);
        pCVar5 = (ChStreamOutAscii *)
                 chrono::ChStreamOutAscii::operator<<
                           (pCVar5,(string *)CONCAT44(extraout_var_01,iVar4));
        pCVar5 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar5,",  typeid: ");
        iVar4 = (*pCVar2->_vptr_ChValue[5])(pCVar2);
        pCVar5 = (ChStreamOutAscii *)
                 chrono::ChStreamOutAscii::operator<<
                           (pCVar5,(char *)CONCAT44(extraout_var_02,iVar4));
        chrono::ChStreamOutAscii::operator<<(pCVar5,"\n");
      }
      if (local_500.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_500.
                        super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_500.
                              super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_500.
                              super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      chrono::ChArchiveExplorer::~ChArchiveExplorer((ChArchiveExplorer *)local_3d8);
      ppCVar7 = local_4a8 + 1;
    } while (local_4a8 + 1 != local_4b0);
  }
  if (local_4e8.super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4e8.
                    super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4e8.
                          super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_4e8.
                          super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_540._0_8_ = &PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_p != &local_510) {
    operator_delete(local_520._M_p,local_510._M_allocated_capacity + 1);
  }
  std::vector<myEmployee,_std::allocator<myEmployee>_>::~vector(&local_558);
  local_420._0_8_ = &PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_p != &local_3f0) {
    operator_delete(local_400._M_p,local_3f0._M_allocated_capacity + 1);
  }
  local_248.super_myEmployee._vptr_myEmployee = (_func_int **)&PTR__myEmployeeBoss_00158338;
  local_248.slave._vptr_myEmployee = (_func_int **)&PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.slave.name._M_dataplus._M_p != &local_248.slave.name.field_2) {
    operator_delete(local_248.slave.name._M_dataplus._M_p,
                    local_248.slave.name.field_2._M_allocated_capacity + 1);
  }
  local_248.super_myEmployee._vptr_myEmployee = (_func_int **)&PTR__myEmployee_00158370;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248.super_myEmployee.name._M_dataplus._M_p !=
      &local_248.super_myEmployee.name.field_2) {
    operator_delete(local_248.super_myEmployee.name._M_dataplus._M_p,
                    local_248.super_myEmployee.name.field_2._M_allocated_capacity + 1);
  }
  chrono::ChArchiveExplorer::~ChArchiveExplorer(&local_1c0);
  return;
}

Assistant:

void my_reflection_example()
{
    ChArchiveExplorer mexplorer;
    mexplorer.SetUseWildcards(true);
    mexplorer.SetUseUserNames(true);

    myEmployeeBoss m_boss(71, 42000.4, true);
    m_boss.body = FAT;

    double my_wages;
    if (mexplorer.FetchValue(my_wages, m_boss, "wages"))
        GetLog() << "Property explorer : retrieved 'wages'=" << my_wages << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'wages'! \n";

    myEmployee my_slave;
    if (mexplorer.FetchValue(my_slave, m_boss, "slave"))
        GetLog() << "Property explorer : retrieved 'slave'=\n" << my_slave << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'slave'! \n";

    int my_age;
    if (mexplorer.FetchValue(my_age, m_boss, "s?*e/age"))
        GetLog() << "Property explorer : retrieved 'slave/age'=" << my_age << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'slave/age'! \n";

    int my_foo = 123;
    if (mexplorer.FetchValue(my_foo, m_boss, "foo"))
        GetLog() << "Property explorer : retrieved 'int foo'=" << my_foo << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve 'int foo'! \n";

    // Test access to containers (std::vector, arrays, etc.). Elements can
    // be fetched using two approaches: integer indexes or menmonic names.
    std::vector<myEmployee> mcontainer;
    mcontainer.push_back(myEmployee(19,4000,ATHLETIC, "Josh"));
    mcontainer.push_back(myEmployeeBoss(29,5000, "Jeff"));
    mcontainer.push_back(myEmployee(31,6000,ATHLETIC, "Marie"));
    myEmployee a_employee;

    // Method A: just use the index in the search string, 
    //   ex: "stuff/arrayofpositions/6/x" as in:

    if (mexplorer.FetchValue(a_employee, mcontainer, "1"))
        GetLog() << "Property explorer : retrieved from element number in container '1' =\n" << a_employee << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve from element number! \n";

    // Method B: if you deal if working with objects that implement 
    // ArchiveContainerName(), you can use the name between single quotation marks '...',
    //   ex: "stuff/arrayofbodies/'Crank'/mass" as in:
    if (mexplorer.FetchValue(a_employee, mcontainer, "'Marie'"))
        GetLog() << "Property explorer : retrieved from element container name 'Marie' =\n" << a_employee << "\n";
    else
        GetLog() << "Property explorer : cannot retrieve from element container name! \n";

    // Test if some object can be explored
    GetLog() << "This has sub properties? : " << mexplorer.IsObject(mcontainer) << "\n";
    GetLog() << "This has sub properties? : " << mexplorer.IsObject(my_age) << "\n\n";

    // Fetch all subproperties of an object using "*"
    GetLog() << "List of fetched properties in std::vector of employees: \n";
    auto props = mexplorer.FetchValues(mcontainer, "*");
    for (auto i : props) {
        GetLog() << " val: " << i->name() << ",  reg.class: " << i->GetClassRegisteredName() << ",  typeid: " << i->GetTypeidName() << "\n";
        //if (auto pi = dynamic_cast<myEmployeeBoss*>(i->PointerUpCast<myEmployee>()))
        //    GetLog() <<"   castable to myEmployeeBoss \n";
        ChArchiveExplorer mexplorer2;
        auto props2 = mexplorer2.FetchValues(*i, "*");
        for (auto i2 : props2) {
            GetLog() << "    val: " << i2->name() << ",  reg.class: " << i2->GetClassRegisteredName() << ",  typeid: " << i2->GetTypeidName() << "\n";
        }
    }
}